

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::Read
          (PosixRandomAccessFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t sVar3;
  void *in_R9;
  Status SStack_28;
  
  (this->super_RandomAccessFile)._vptr_RandomAccessFile = (_func_int **)0x0;
  sVar1 = pread(*(int *)(offset + 0x28),in_R9,(size_t)result,n);
  sVar3 = 0;
  if (0 < sVar1) {
    sVar3 = sVar1;
  }
  *(void **)scratch = in_R9;
  *(ssize_t *)(scratch + 8) = sVar3;
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    IOError((anon_unknown_1 *)&SStack_28,(string *)(offset + 8),*piVar2);
    Status::operator=((Status *)this,&SStack_28);
    Status::~Status(&SStack_28);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Read(uint64_t offset, size_t n, Slice *result,
                                char *scratch) const {
                Status s;
                ssize_t r = pread(fd_, scratch, n, static_cast<off_t>(offset));
                *result = Slice(scratch, (r < 0) ? 0 : r);
                if (r < 0) {
                    // An error: return a non-ok status
                    s = IOError(filename_, errno);
                }
                return s;
            }